

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

int __thiscall Player::attack(Player *this)

{
  string *psVar1;
  pointer pcVar2;
  pointer ppPVar3;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> countries;
  int iVar4;
  uint uVar5;
  int iVar6;
  Player **i;
  PlayerState *pPVar7;
  ostream *poVar8;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar9;
  long *plVar10;
  pointer ppCVar11;
  GameLoop *pGVar12;
  pointer ppPVar13;
  int iVar14;
  long lVar15;
  pointer ppCVar16;
  char *pcVar17;
  Country **neighbour;
  undefined4 in_stack_ffffffffffffff88;
  Country *in_stack_ffffffffffffff90;
  Country *pCVar18;
  pointer ppCVar19;
  long local_60;
  Country *local_58 [2];
  uint local_44;
  Country *local_40;
  Player *local_38;
  
  operator_delete(this->currentState,4);
  pPVar7 = (PlayerState *)operator_new(4);
  *pPVar7 = ATTACKING;
  this->currentState = pPVar7;
  notifyAll(this);
  psVar1 = this->strategy->strategyName;
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  ppCVar19 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff98,pcVar2,pcVar2 + psVar1->_M_string_length);
  iVar4 = std::__cxx11::string::compare((char *)&stack0xffffffffffffff98);
  if (ppCVar19 != local_58) {
    operator_delete(ppCVar19,(ulong)((long)&local_58[0]->cyID + 1));
  }
  if (iVar4 == 0) {
    iVar4 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,0);
    return (int)(char)iVar4;
  }
  iVar4 = 0;
  local_38 = this;
LAB_00118790:
  std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x140528);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"It is Player ",0xd);
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'s turn to attack!",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n[ATTACKER] Will you attack?(y/n)",0x21);
  uVar5 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,0);
  if ((char)uVar5 == 'y') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nPlayer ",8);
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," has chosen to attack!",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    do {
      while( true ) {
        std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x140528);
        std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector
                  ((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)
                   &stack0xffffffffffffff98,this->pOwnedCountries);
        countries.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = iVar4;
        countries.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = in_stack_ffffffffffffff88;
        countries.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff90;
        countries.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = ppCVar19;
        showCountries(countries);
        if (ppCVar19 != (pointer)0x0) {
          operator_delete(ppCVar19,(long)local_58[0] - (long)ppCVar19);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "\n[ATTACKER] From which country do you want to attack?(choose 0 to ",0x42);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
        uVar5 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,1);
        if (-1 < (int)uVar5) break;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nInvalid Input. Please try again.\n",0x22);
      }
      pvVar9 = this->pOwnedCountries;
      iVar6 = (int)((ulong)((long)(pvVar9->
                                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar9->
                                 super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((iVar6 <= (int)uVar5) || (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nInvalid Input. Please try again.\n",0x22);
        pvVar9 = this->pOwnedCountries;
        iVar6 = (int)((ulong)((long)(pvVar9->
                                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar9->
                                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 3);
      }
    } while ((iVar6 <= (int)uVar5) || (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0))
    ;
    ppCVar19 = (pvVar9->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl
               .super__Vector_impl_data._M_start;
    if ((ulong)((long)(pvVar9->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar19 >> 3) <=
        (ulong)uVar5) {
LAB_00119133:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    in_stack_ffffffffffffff90 = ppCVar19[uVar5];
    if (1 < *in_stack_ffffffffffffff90->pNumberOfTroops) {
      do {
        while( true ) {
          std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x140528);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nCountry ",9);
          pcVar2 = (in_stack_ffffffffffffff90->cyName->_M_dataplus)._M_p;
          pCVar18 = in_stack_ffffffffffffff90;
          ppCVar19 = local_58;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xffffffffffffff98,pcVar2,
                     pcVar2 + in_stack_ffffffffffffff90->cyName->_M_string_length);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)ppCVar19,local_60);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," has ",5);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," neighbour(s):\n",0xf);
          if (ppCVar19 != local_58) {
            operator_delete(ppCVar19,(ulong)((long)&local_58[0]->cyID + 1));
          }
          ppCVar16 = (in_stack_ffffffffffffff90->pAdjCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          for (ppCVar11 = (in_stack_ffffffffffffff90->pAdjCountries->
                          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                          _M_impl.super__Vector_impl_data._M_start; ppCVar11 != ppCVar16;
              ppCVar11 = ppCVar11 + 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tName: ",8)
            ;
            pcVar2 = ((*ppCVar11)->cyName->_M_dataplus)._M_p;
            ppCVar19 = local_58;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&stack0xffffffffffffff98,pcVar2,
                       pcVar2 + (*ppCVar11)->cyName->_M_string_length);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)ppCVar19,local_60);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," Armies: ",9);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,*(*ppCVar11)->pNumberOfTroops);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," Owned by: Player ",0x12);
            plVar10 = (long *)std::ostream::operator<<(poVar8,*(*ppCVar11)->pPlayerOwnerId);
            std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
            std::ostream::put((char)plVar10);
            std::ostream::flush();
            if (ppCVar19 != local_58) {
              operator_delete(ppCVar19,(ulong)((long)&local_58[0]->cyID + 1));
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "\n[ATTACKER] Which country would you like to attack?(0 to ",0x39);
          in_stack_ffffffffffffff90 = pCVar18;
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          this = local_38;
          uVar5 = (*local_38->strategy->_vptr_PlayerStrategy[1])(local_38->strategy,2);
          if (-1 < (int)uVar5) break;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\nInvalid Input. Please try again.\n",0x22);
        }
        ppCVar11 = (pCVar18->pAdjCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppCVar16 = (pCVar18->pAdjCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        iVar6 = (int)((ulong)((long)ppCVar16 - (long)ppCVar11) >> 3);
        if ((iVar6 < (int)uVar5) || (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\nInvalid Input. Please try again.\n",0x22);
          ppCVar11 = (in_stack_ffffffffffffff90->pAdjCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          ppCVar16 = (in_stack_ffffffffffffff90->pAdjCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          iVar6 = (int)((ulong)((long)ppCVar16 - (long)ppCVar11) >> 3);
        }
      } while ((iVar6 < (int)uVar5) ||
              (lVar15 = *(long *)(std::cin + -0x18), ((byte)secure_getenv[lVar15] & 5) != 0));
      if ((ulong)((long)ppCVar16 - (long)ppCVar11 >> 3) <= (ulong)uVar5) goto LAB_00119133;
      local_40 = ppCVar11[uVar5];
      if (*in_stack_ffffffffffffff90->pPlayerOwnerId != *local_40->pPlayerOwnerId) {
        do {
          std::ios::clear((int)lVar15 + 0x140528);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\n[ATTACKER] How many dice will Player ",0x26);
          poVar8 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," roll?(1 to ",0xc);
          if (*in_stack_ffffffffffffff90->pNumberOfTroops < 4) {
            plVar10 = (long *)std::ostream::operator<<
                                        (&std::cout,*in_stack_ffffffffffffff90->pNumberOfTroops + -1
                                        );
            lVar15 = 1;
            pcVar17 = ")";
          }
          else {
            lVar15 = 2;
            plVar10 = &std::cout;
            pcVar17 = "3)";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar10,pcVar17,lVar15);
          uVar5 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,3);
          if ((int)uVar5 < 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\nInvalid Input. Please try again.\n",0x22);
          }
          else {
            if (((3 < uVar5) ||
                (iVar6 = *in_stack_ffffffffffffff90->pNumberOfTroops, iVar6 <= (int)uVar5)) ||
               (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"\nInvalid Input. Please try again.\n",0x22);
              iVar6 = *in_stack_ffffffffffffff90->pNumberOfTroops;
            }
            if (((uVar5 < 4) && ((int)uVar5 < iVar6)) &&
               (lVar15 = *(long *)(std::cin + -0x18), ((byte)secure_getenv[lVar15] & 5) == 0))
            goto LAB_00118e6c;
          }
          lVar15 = *(long *)(std::cin + -0x18);
        } while( true );
      }
      lVar15 = 0x3f;
      pcVar17 = "\n[ATTACKER] You cannot attack your own country! Proceeding...\n\n";
      goto LAB_00118843;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Country ",8);
    pcVar2 = (in_stack_ffffffffffffff90->cyName->_M_dataplus)._M_p;
    ppCVar19 = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffff98,pcVar2,
               pcVar2 + in_stack_ffffffffffffff90->cyName->_M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)ppCVar19,local_60);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               " does not have enough armies to attack. Choose a different country. Proceeding...\n"
               ,0x52);
    if (ppCVar19 != local_58) {
      operator_delete(ppCVar19,(ulong)((long)&local_58[0]->cyID + 1));
    }
    goto LAB_00118a66;
  }
  if ((uVar5 & 0xff) == 0x6e) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nPlayer ",8);
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," has chosen NOT to attack!",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    goto LAB_001190f6;
  }
  lVar15 = 0x22;
  pcVar17 = "\nInvalid Input. Please try again.\n";
LAB_00118843:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar17,lVar15);
LAB_00118a66:
  iVar4 = iVar4 + 1;
  if (iVar4 == 10) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\nInvalid user input for 10 consecutive prompts, aborting action.\n",0x41);
LAB_001190f6:
    operator_delete(this->currentState,4);
    pPVar7 = (PlayerState *)operator_new(4);
    *pPVar7 = IDLE;
    this->currentState = pPVar7;
    (*this->strategy->_vptr_PlayerStrategy[5])();
    return 0;
  }
  goto LAB_00118790;
LAB_00118e6c:
  local_44 = uVar5;
  std::ios::clear((int)lVar15 + 0x140528);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n[DEFENDER] How many dice will Player ",0x26);
  pCVar18 = local_40;
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,*local_40->pPlayerOwnerId);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," roll?(1 to ",0xc);
  pcVar17 = "1)";
  if (1 < *pCVar18->pNumberOfTroops) {
    pcVar17 = "2)";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar17,2);
  iVar6 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,5);
  if (iVar6 - 3U < 0xfffffffe) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nInvalid Input. Please try again.\n",0x22);
  }
  else {
    iVar14 = *pCVar18->pNumberOfTroops;
    if ((iVar14 < iVar6) || (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nInvalid Input. Please try again.\n",0x22);
      iVar14 = *pCVar18->pNumberOfTroops;
    }
    if ((iVar6 <= iVar14) && (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) == 0))
    goto LAB_00118f72;
  }
  lVar15 = *(long *)(std::cin + -0x18);
  uVar5 = local_44;
  goto LAB_00118e6c;
LAB_00118f72:
  pGVar12 = GameLoop::getInstance();
  ppPVar13 = (pGVar12->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppPVar3 = (pGVar12->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppPVar13 == ppPVar3) {
LAB_0011903f:
    operator_delete(this->currentState,4);
    pPVar7 = (PlayerState *)operator_new(4);
    *pPVar7 = IDLE;
    this->currentState = pPVar7;
    (*this->strategy->_vptr_PlayerStrategy[5])();
    return -1;
  }
  while (*(*ppPVar13)->pPlayerId != *local_40->pPlayerOwnerId) {
    ppPVar13 = ppPVar13 + 1;
    if (ppPVar13 == ppPVar3) goto LAB_0011903f;
  }
  iVar6 = executeAttack(this,in_stack_ffffffffffffff90,local_40,*ppPVar13,local_44,iVar6);
  if (iVar6 == 1) {
    lVar15 = 0x21;
    pcVar17 = "\n[ATTACK SUCCEEDED] - Proceeding.";
  }
  else {
    lVar15 = 0x3f;
    pcVar17 = "\n[ATTACK FAILED] - Make sure that you chose appropriate values.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar17,lVar15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  goto LAB_00118a66;
}

Assistant:

int Player::attack() {

    char playerChoice = 0;
    int fromCountryIndex;
    int toCountryIndex;
    int numAttackingDice;
    int numDefendingDice;

    this->setPlayerState(PlayerState::ATTACKING);
    this->notifyAll();

    if ( this->getStrategy()->getStrategyName() == "CHEATER") {
        return (PlayerAction) this->getStrategy()->yesOrNo(StrategyContext::ATTACK);
    }

    /* USER DECISION TO ATTACK OR NOT*/
    int failsafeCounter = 0;
    do {
        //avoid infinite loops in case of bot malfunction or human delaying the game
        if(failsafeCounter >= 10){
            std::cout << "\nInvalid user input for 10 consecutive prompts, aborting action.\n";
            this->setPlayerState(PlayerState::IDLE);
            this->strategy->resetChoices();
            return PlayerAction::ABORTED;
        }
        failsafeCounter++;

        std::cin.clear();
        std::cout << "It is Player " << this->getPlayerId() << "'s turn to attack!" << std::endl;
        std::cout << "\n[ATTACKER] Will you attack?(y/n)";
        playerChoice = strategy->yesOrNo(StrategyContext::ATTACK);
        if (playerChoice != 'y' && playerChoice != 'n') {
            std::cout << "\nInvalid Input. Please try again.\n";
            continue;
        }

        if (playerChoice == 'y') {
            std::cout << "\nPlayer " << this->getPlayerId() << " has chosen to attack!" << std::endl;
            /*USER CHOOSES FROM WHICH COUNTRY TO ATTACK*/
            fromCountryIndex = getAttackingCountry(this);
        } else {
            std::cout << "\nPlayer " << this->getPlayerId() << " has chosen NOT to attack!" << std::endl;
            this->setPlayerState(PlayerState::IDLE);
            this->strategy->resetChoices();
            return PlayerAction::ABORTED;
        }

        // Get the country to attack from
        Map::Country *fromCountry = this->getOwnedCountries()->at(fromCountryIndex);
        if (fromCountry->getNumberOfTroops() < 2) {
            std::cout << "Country " << fromCountry->getCountryName()
                      << " does not have enough armies to attack. Choose a different country. Proceeding...\n";
            continue;
        }

        /* USER CHOOSES WHICH COUNTRY TO ATTACK*/
        toCountryIndex = getDefendingCountry(fromCountry, this);

        Map::Country *toCountry = fromCountry->getAdjCountries()->at(toCountryIndex);
        if (fromCountry->getPlayerOwnerID() == toCountry->getPlayerOwnerID()) {
            std::cout << "\n[ATTACKER] You cannot attack your own country! Proceeding...\n\n";
            continue;
        }

        /*ATTACKER CHOOSES HOW MANY DICE TO ROLL*/
        numAttackingDice = getNumAttackingDice(this, fromCountry);

        /*DEFENDER CHOOSES HOW MANY DICE TO ROLL*/
        numDefendingDice = getNumDefendingDice(toCountry, this);

        /* GET THE DEFENDING PLAYER */
        Player *defendingPlayer = nullptr;
        for (auto &i : *GameLoop::getInstance()->getAllPlayers()) {
            if (i->getPlayerId() == toCountry->getPlayerOwnerID()) {
                defendingPlayer = i;
                break;
            }
        }
        if (defendingPlayer == nullptr) {
            this->setPlayerState(PlayerState::IDLE);
            this->strategy->resetChoices();
            return PlayerAction::FAILED;
        }

        if (this->executeAttack(fromCountry, toCountry, defendingPlayer, numAttackingDice, numDefendingDice) == PlayerAction::SUCCEEDED) {
            std::cout << "\n[ATTACK SUCCEEDED] - Proceeding." << std::endl;
            continue;
        } else {
            std::cout << "\n[ATTACK FAILED] - Make sure that you chose appropriate values." << std::endl;
            continue;
        }
    } while (true);
}